

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O1

void __thiscall HTTPWorkItem::operator()(HTTPWorkItem *this)

{
  long in_FS_OFFSET;
  _Head_base<0UL,_HTTPRequest_*,_false> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10._M_head_impl =
       (this->req)._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>._M_t.
       super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
       super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl;
  if ((this->func).super__Function_base._M_manager == (_Manager_type)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      std::__throw_bad_function_call();
    }
  }
  else {
    (*(this->func)._M_invoker)((_Any_data *)&this->func,&local_10._M_head_impl,&this->path);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void operator()() override
    {
        func(req.get(), path);
    }